

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnativesocketengine_unix.cpp
# Opt level: O0

int __thiscall QNativeSocketEnginePrivate::option(QNativeSocketEnginePrivate *this,SocketOption opt)

{
  int iVar1;
  QNativeSocketEngine *pQVar2;
  ulong uVar3;
  SocketOption in_ESI;
  QNativeSocketEnginePrivate *in_RDI;
  long in_FS_OFFSET;
  QNativeSocketEngine *q;
  size_t size;
  socklen_t len;
  int v;
  int level;
  int n;
  uchar dest;
  uint local_64;
  uint local_34;
  socklen_t local_1c;
  uint local_18;
  int local_14;
  int local_10;
  undefined1 local_9;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = q_func(in_RDI);
  uVar3 = (**(code **)(*(long *)&pQVar2->super_QAbstractSocketEngine + 0x78))();
  if ((uVar3 & 1) == 0) {
    local_34 = 0xffffffff;
    goto LAB_00359ff0;
  }
  switch(in_ESI) {
  case NonBlockingSocketOption:
  case BroadcastSocketOption:
  case BindExclusively:
    local_34 = 0xffffffff;
    goto LAB_00359ff0;
  default:
    break;
  case MaxStreamsSocketOption:
    local_34 = 0xffffffff;
    goto LAB_00359ff0;
  case PathMtuInformation:
  }
  local_10 = -0x55555556;
  local_14 = -0x55555556;
  local_18 = 0;
  local_1c = 4;
  convertToLevelAndOption
            (in_ESI,(in_RDI->super_QAbstractSocketEnginePrivate).socketProtocol,&local_14,&local_10)
  ;
  if ((local_10 == -1) ||
     (iVar1 = getsockopt((int)in_RDI->socketDescriptor,local_14,local_10,&local_18,&local_1c),
     iVar1 == -1)) {
    local_34 = 0xffffffff;
  }
  else {
    if (local_1c == 1) {
      local_9 = (undefined1)local_18;
      local_64 = local_18 & 0xff;
    }
    else {
      local_64 = local_18;
    }
    local_34 = local_64;
  }
LAB_00359ff0:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_34;
  }
  __stack_chk_fail();
}

Assistant:

int QNativeSocketEnginePrivate::option(QNativeSocketEngine::SocketOption opt) const
{
    Q_Q(const QNativeSocketEngine);
    if (!q->isValid())
        return -1;

    // handle non-getsockopt and specific cases first
    switch (opt) {
    case QNativeSocketEngine::BindExclusively:
    case QNativeSocketEngine::NonBlockingSocketOption:
    case QNativeSocketEngine::BroadcastSocketOption:
        return -1;
    case QNativeSocketEngine::MaxStreamsSocketOption: {
#ifndef QT_NO_SCTP
        sctp_initmsg sctpInitMsg;
        QT_SOCKOPTLEN_T sctpInitMsgSize = sizeof(sctpInitMsg);
        if (::getsockopt(socketDescriptor, SOL_SCTP, SCTP_INITMSG, &sctpInitMsg,
                         &sctpInitMsgSize) == 0)
            return int(qMin(sctpInitMsg.sinit_num_ostreams, sctpInitMsg.sinit_max_instreams));
#endif
        return -1;
    }

    case QNativeSocketEngine::PathMtuInformation:
#if defined(IPV6_PATHMTU) && !defined(IPV6_MTU)
        // Prefer IPV6_MTU (handled by convertToLevelAndOption), if available
        // (Linux); fall back to IPV6_PATHMTU otherwise (FreeBSD):
        if (socketProtocol == QAbstractSocket::IPv6Protocol) {
            ip6_mtuinfo mtuinfo;
            QT_SOCKOPTLEN_T len = sizeof(mtuinfo);
            if (::getsockopt(socketDescriptor, IPPROTO_IPV6, IPV6_PATHMTU, &mtuinfo, &len) == 0)
                return int(mtuinfo.ip6m_mtu);
            return -1;
        }
#endif
        break;

    default:
        break;
    }

    int n, level;
    int v = 0;
    QT_SOCKOPTLEN_T len = sizeof(v);

    convertToLevelAndOption(opt, socketProtocol, level, n);
    if (n != -1 && ::getsockopt(socketDescriptor, level, n, (char *) &v, &len) != -1)
        return len == 1 ? qFromUnaligned<quint8>(&v) : v;

    return -1;
}